

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O3

void __thiscall csv::CSVRow::iterator::iterator(iterator *this,CSVRow *_reader,int _i)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  CSVField *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  this->daddy = _reader;
  (this->field).super___shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->field).super___shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->i = _i;
  if (_i < (int)_reader->row_length) {
    _Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)get_field(_reader,(long)_i);
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
    p_Var1->_M_use_count = 1;
    p_Var1->_M_weak_count = 1;
    p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00118c20;
    *(longdouble *)(p_Var1 + 1) = (longdouble)0;
    p_Var1[2] = _Var2;
    *(undefined4 *)&p_Var1[3]._vptr__Sp_counted_base = 0xffffffff;
    (this->field).super___shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var1 + 1);
    this_00 = (this->field).super___shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->field).super___shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var1;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
  }
  else {
    (this->field).super___shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->field).super___shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  return;
}

Assistant:

CSVRow::iterator::iterator(const CSVRow* _reader, int _i)
        : daddy(_reader), i(_i) {
        if (_i < (int)this->daddy->size())
            this->field = std::make_shared<CSVField>(
                this->daddy->operator[](_i));
        else
            this->field = nullptr;
    }